

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_strtou32(string *str,uint32 *value)

{
  bool bVar1;
  string *in_RDI;
  uint *unaff_retaddr;
  string *in_stack_00000008;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RDI);
  bVar1 = safe_uint_internal<unsigned_int>(in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_30);
  return bVar1;
}

Assistant:

bool safe_strtou32(const string& str, uint32* value) {
  return safe_uint_internal(str, value);
}